

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::LoadIntLoadResidual_F
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this,ChVectorDynamic<> *R,double c)

{
  shared_ptr<chrono::ChLoadableU> *__r;
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  uint uVar4;
  Scalar *pSVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  uint local_54;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_50;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_48;
  double local_40;
  Scalar local_38;
  
  __r = &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable;
  local_50 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader.Q;
  iVar8 = 0;
  local_54 = 0;
  local_48 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R;
  local_40 = c;
  while( true ) {
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableU,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
    iVar3 = (**(code **)(*local_68 + 0x40))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    if (iVar3 <= iVar8) break;
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableU,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
    cVar2 = (**(code **)(*local_68 + 0x58))(local_68,iVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    if (cVar2 != '\0') {
      std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadableU,void>
                ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = (**(code **)(*local_68 + 0x48))(local_68,iVar8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      uVar6 = (ulong)local_54;
      uVar7 = 0;
      while( true ) {
        std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChLoadableU,void>
                  ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                   &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
        uVar4 = (**(code **)(*local_68 + 0x50))(local_68,iVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        if (uVar4 <= uVar7) break;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (local_50,uVar6 + uVar7 & 0xffffffff);
        local_38 = *pSVar5;
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           (local_48,(ulong)(uint)(iVar3 + (int)uVar7));
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_40;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_38;
        uVar7 = uVar7 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *pSVar5;
        auVar1 = vfmadd213sd_fma(auVar10,auVar9,auVar1);
        *pSVar5 = auVar1._0_8_;
      }
      local_54 = local_54 + (int)uVar7;
    }
    iVar8 = iVar8 + 1;
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_F(ChVectorDynamic<>& R, double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += this->loader.Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}